

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall Js::InterpreterStackFrame::ProcessAsmJsModule(InterpreterStackFrame *this)

{
  WriteBarrierPtr<void> *addr;
  DisableImplicitFlags DVar1;
  ImplicitCallFlags IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FunctionProxy *this_00;
  long lVar6;
  ScriptFunction *func;
  PropertyIdArray *propIds;
  code *pcVar7;
  bool bVar8;
  BOOL BVar9;
  int iVar10;
  int iVar11;
  AsmJsModuleInfo *info;
  Recycler *pRVar12;
  undefined4 *puVar13;
  Var pvVar14;
  ModuleVar *pMVar15;
  ModuleVarImport *pMVar16;
  RecyclableObject *pRVar17;
  PropertyRecord *pPVar18;
  ThreadContext *pTVar19;
  ModuleFunctionImport *pMVar20;
  FrameDisplay *environment;
  ModuleFunction *pMVar21;
  FunctionInfoPtrPtr infoRef;
  AsmJsScriptFunction *function;
  FunctionBody *this_01;
  void *pvVar22;
  ProxyEntryPointInfo *pPVar23;
  ModuleFunctionTable *pMVar24;
  undefined4 extraout_var;
  JavascriptMethod p_Var25;
  Type *literalType;
  WriteBarrierPtr<void> *pWVar26;
  ScriptContext *pSVar27;
  ulong uVar28;
  char16_t *message;
  long lVar29;
  uint uVar30;
  int i;
  int iVar31;
  uint index;
  size_t __n;
  size_t sVar32;
  char *addr_00;
  double dVar33;
  undefined1 local_c8 [8];
  TrackAllocData data;
  Var local_68;
  WriteBarrierPtr<void> *local_60;
  WriteBarrierPtr<void> *local_50;
  char *local_40;
  
  this_00 = *(FunctionProxy **)(this + 0x88);
  info = (AsmJsModuleInfo *)FunctionProxy::GetAuxPtr(this_00,AsmJsModuleInfo);
  if (DAT_015b5f9a == '\x01') {
    pSVar27 = *(ScriptContext **)(this + 0x78);
    message = L"Asm.js Runtime Error : Forcing link failure";
LAB_0099a457:
    AsmJSCompiler::OutputError(pSVar27,message);
    pvVar14 = ProcessLinkFailedAsmJsModule(this);
    return pvVar14;
  }
  if (*(int *)(this + 0x18) != info->mArgInCount + 1) {
    pSVar27 = *(ScriptContext **)(this + 0x78);
    message = L"Asm.js Runtime Error : Invalid module argument count";
    goto LAB_0099a457;
  }
  data.plusSize = (size_t)(info->mModuleMemory).mMemorySize;
  local_c8 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_4bd2daf;
  data.filename._0_4_ = 0xa68;
  pRVar12 = Memory::Recycler::TrackAllocInfo
                      (*(Recycler **)(*(long *)(this + 0x78) + 0x1200),(TrackAllocData *)local_c8);
  iVar11 = (info->mModuleMemory).mMemorySize;
  if ((long)iVar11 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar12,(TrackAllocData *)0x0);
    local_50 = (WriteBarrierPtr<void> *)&DAT_00000008;
  }
  else {
    __n = (long)iVar11 << 3;
    sVar32 = 0xffffffffffffffff;
    if (-1 < iVar11) {
      sVar32 = __n;
    }
    BVar9 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar9 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar8) goto LAB_0099b329;
      *puVar13 = 0;
    }
    local_50 = (WriteBarrierPtr<void> *)
               Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                         (pRVar12,sVar32);
    if (local_50 == (WriteBarrierPtr<void> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar8) goto LAB_0099b329;
      *puVar13 = 0;
    }
    memset(local_50,0,__n);
  }
  lVar29 = (long)(info->mModuleMemory).mArrayBufferOffset;
  if (lVar29 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0xa6a,
                                "(moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset)"
                                ,
                                "moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset"
                               );
    if (!bVar8) {
LAB_0099b329:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar13 = 0;
  }
  local_60 = local_50 + (info->mModuleMemory).mStdLibOffset;
  if (*(int *)(this + 0x18) < 2) {
    pvVar22 = (void *)0x0;
  }
  else {
    pvVar22 = *(void **)(*(long *)(this + 0x20) + 8);
  }
  pWVar26 = (WriteBarrierPtr<void> *)(long)(info->mModuleMemory).mIntOffset;
  iVar11 = (info->mModuleMemory).mFloatOffset;
  iVar31 = (info->mModuleMemory).mDoubleOffset;
  iVar3 = (info->mModuleMemory).mFFIOffset;
  iVar4 = (info->mModuleMemory).mFuncOffset;
  iVar5 = (info->mModuleMemory).mFuncPtrOffset;
  lVar6 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  Memory::Recycler::WBSetBit((char *)local_60);
  local_60->ptr = pvVar22;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(local_60);
  if (*(int *)(this + 0x18) < 3) {
    local_68 = (Var)0x0;
  }
  else {
    local_68 = *(Var *)(*(long *)(this + 0x20) + 0x10);
  }
  addr = local_50 + lVar29;
  if (*(int *)(this + 0x18) < 4) {
    pvVar22 = (void *)0x0;
  }
  else {
    pvVar22 = *(void **)(*(long *)(this + 0x20) + 0x18);
  }
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pvVar22;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  DVar1 = *(DisableImplicitFlags *)(lVar6 + 0x1542);
  IVar2 = *(ImplicitCallFlags *)(lVar6 + 0x1570);
  *(DisableImplicitFlags *)(lVar6 + 0x1542) = DVar1 | DisableImplicitCallFlag;
  *(undefined1 *)(lVar6 + 0x1570) = 1;
  bVar8 = ASMLink::CheckParams
                    (*(ScriptContext **)(this + 0x78),info,local_60->ptr,local_68,addr->ptr);
  if (bVar8) {
    pSVar27 = *(ScriptContext **)(this + 0x78);
    pTVar19 = pSVar27->threadContext;
    if (ImplicitCall_None < pTVar19->implicitCallFlags) {
      pTVar19->disableImplicitFlags = DVar1;
      pTVar19->implicitCallFlags = IVar2;
      AsmJSCompiler::OutputError(pSVar27,L"Asm.js Runtime Error : Params have side effects");
      goto LAB_0099b21c;
    }
    data._32_8_ = local_50 + (long)pWVar26;
    if (0 < info->mVarCount) {
      local_60 = (WriteBarrierPtr<void> *)0x0;
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pMVar15 = AsmJsModuleInfo::GetVar(info,(int)local_60);
        AsmJsVarType::AsmJsVarType((AsmJsVarType *)local_c8,pMVar15->type);
        if (local_c8[0] == Float) {
          *(Type *)((long)&local_50[iVar11].ptr + (ulong)pMVar15->location * 4) =
               (pMVar15->initialiser).intInit;
        }
        else if (local_c8[0] == Double) {
          *(Type *)(local_50 + (long)iVar31 + (ulong)pMVar15->location) = pMVar15->initialiser;
        }
        else if (local_c8[0] == Int) {
          *(Type *)(data._32_8_ + (ulong)pMVar15->location * 4) = (pMVar15->initialiser).intInit;
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0xa9c,"((0))","UNREACHED");
          if (!bVar8) goto LAB_0099b329;
          *puVar13 = 0;
        }
        uVar30 = (int)local_60 + 1;
        local_60 = (WriteBarrierPtr<void> *)(ulong)uVar30;
      } while ((int)uVar30 < info->mVarCount);
    }
    iVar10 = 10;
    if (0 < info->mVarImportCount) {
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      i = 0;
      local_60 = pWVar26;
      do {
        pMVar16 = AsmJsModuleInfo::GetVarImport(info,i);
        AsmJsVarType::AsmJsVarType((AsmJsVarType *)local_c8,pMVar16->type);
        pvVar14 = JavascriptOperators::OP_GetProperty
                            (local_68,pMVar16->field,*(ScriptContext **)(this + 0x78));
        pSVar27 = *(ScriptContext **)(this + 0x78);
        pTVar19 = pSVar27->threadContext;
        if (pTVar19->implicitCallFlags < 2) {
          if ((DAT_015aa2da == '\x01') && (bVar8 = VarIs<Js::RecyclableObject>(pvVar14), bVar8)) {
            bVar8 = VarIs<Js::RecyclableObject>(pvVar14);
            if (bVar8) {
              pRVar17 = VarTo<Js::RecyclableObject>(pvVar14);
              bVar8 = DynamicType::Is(((pRVar17->type).ptr)->typeId);
              if (!bVar8) goto LAB_0099a834;
            }
            pSVar27 = *(ScriptContext **)(this + 0x78);
            pPVar18 = ScriptContext::GetPropertyName(pSVar27,pMVar16->field);
            bVar8 = false;
            AsmJSCompiler::OutputError
                      (pSVar27,L"Asm.js Runtime Error : Var import %s must be primitive",pPVar18 + 1
                      );
            iVar10 = 4;
          }
          else {
LAB_0099a834:
            if (local_c8[0] == Float) {
              pSVar27 = *(ScriptContext **)(this + 0x78);
              if (((ulong)pvVar14 & 0x1ffff00000000) != 0x1000000000000 &&
                  ((ulong)pvVar14 & 0xffff000000000000) == 0x1000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar13 = 1;
                bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar8) goto LAB_0099b329;
                *puVar13 = 0;
              }
              if (((ulong)pvVar14 & 0xffff000000000000) == 0x1000000000000) {
                dVar33 = (double)(int)pvVar14;
              }
              else if (pvVar14 < (Var)0x4000000000000) {
                dVar33 = JavascriptConversion::ToNumber_Full(pvVar14,pSVar27);
              }
              else {
                dVar33 = (double)((ulong)pvVar14 ^ 0xfffc000000000000);
              }
              *(float *)((long)&local_50[iVar11].ptr + (ulong)pMVar16->location * 4) = (float)dVar33
              ;
            }
            else if (local_c8[0] == Double) {
              pSVar27 = *(ScriptContext **)(this + 0x78);
              if (((ulong)pvVar14 & 0x1ffff00000000) != 0x1000000000000 &&
                  ((ulong)pvVar14 & 0xffff000000000000) == 0x1000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar13 = 1;
                bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar8) goto LAB_0099b329;
                *puVar13 = 0;
              }
              if (((ulong)pvVar14 & 0xffff000000000000) == 0x1000000000000) {
                pvVar22 = (void *)(double)(int)pvVar14;
              }
              else if (pvVar14 < (Var)0x4000000000000) {
                pvVar22 = (void *)JavascriptConversion::ToNumber_Full(pvVar14,pSVar27);
              }
              else {
                pvVar22 = (void *)((ulong)pvVar14 ^ 0xfffc000000000000);
              }
              local_50[(long)iVar31 + (ulong)pMVar16->location].ptr = pvVar22;
            }
            else if (local_c8[0] == Int) {
              pSVar27 = *(ScriptContext **)(this + 0x78);
              if (((ulong)pvVar14 & 0x1ffff00000000) != 0x1000000000000 &&
                  ((ulong)pvVar14 & 0xffff000000000000) == 0x1000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar13 = 1;
                bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar8) goto LAB_0099b329;
                *puVar13 = 0;
              }
              if (((ulong)pvVar14 & 0xffff000000000000) == 0x1000000000000) {
                if (((ulong)pvVar14 & 0x1ffff00000000) != 0x1000000000000) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar13 = 1;
                  bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                              ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                              "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                  if (!bVar8) goto LAB_0099b329;
                  *puVar13 = 0;
                }
              }
              else {
                uVar30 = JavascriptMath::ToInt32_Full(pvVar14,pSVar27);
                pvVar14 = (Var)(ulong)uVar30;
              }
              *(int *)(data._32_8_ + (ulong)pMVar16->location * 4) = (int)pvVar14;
            }
            pSVar27 = *(ScriptContext **)(this + 0x78);
            pTVar19 = pSVar27->threadContext;
            if (ImplicitCall_None < pTVar19->implicitCallFlags) goto LAB_0099ab5b;
            iVar10 = 0;
            bVar8 = true;
          }
        }
        else {
LAB_0099ab5b:
          pTVar19->disableImplicitFlags = DVar1;
          pTVar19->implicitCallFlags = IVar2;
          pPVar18 = ScriptContext::GetPropertyName(pSVar27,pMVar16->field);
          bVar8 = false;
          AsmJSCompiler::OutputError
                    (pSVar27,L"Asm.js Runtime Error : Accessing var import %s has side effects",
                     pPVar18 + 1);
          local_60 = (WriteBarrierPtr<void> *)ProcessLinkFailedAsmJsModule(this);
          iVar10 = 1;
        }
        if (!bVar8) goto LAB_0099abd0;
        i = i + 1;
      } while (i < info->mVarImportCount);
      iVar10 = 10;
    }
LAB_0099abd0:
    if (iVar10 != 4) {
      if (iVar10 != 10) {
        return local_60;
      }
      iVar11 = 0xd;
      if (0 < info->mFunctionImportCount) {
        iVar31 = 0;
        do {
          pMVar20 = AsmJsModuleInfo::GetFunctionImport(info,iVar31);
          pvVar14 = JavascriptOperators::OP_GetProperty
                              (local_68,pMVar20->field,*(ScriptContext **)(this + 0x78));
          pSVar27 = *(ScriptContext **)(this + 0x78);
          pTVar19 = pSVar27->threadContext;
          if (pTVar19->implicitCallFlags < 2) {
            bVar8 = VarIs<Js::JavascriptFunction>(pvVar14);
            if (bVar8) {
              pWVar26 = local_50 + (long)iVar3 + (ulong)pMVar20->location;
              Memory::Recycler::WBSetBit((char *)pWVar26);
              pWVar26->ptr = pvVar14;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar26);
              iVar11 = 0;
              bVar8 = true;
            }
            else {
              pSVar27 = *(ScriptContext **)(this + 0x78);
              pPVar18 = ScriptContext::GetPropertyName(pSVar27,pMVar20->field);
              bVar8 = false;
              AsmJSCompiler::OutputError
                        (pSVar27,
                         L"Asm.js Runtime Error : Foreign function import %s is not a function",
                         pPVar18 + 1);
              iVar11 = 4;
            }
          }
          else {
            pTVar19->disableImplicitFlags = DVar1;
            pTVar19->implicitCallFlags = IVar2;
            pPVar18 = ScriptContext::GetPropertyName(pSVar27,pMVar20->field);
            bVar8 = false;
            AsmJSCompiler::OutputError
                      (pSVar27,
                       L"Asm.js Runtime Error : Accessing foreign function import %s has side effects"
                       ,pPVar18 + 1);
            local_60 = (WriteBarrierPtr<void> *)ProcessLinkFailedAsmJsModule(this);
            iVar11 = 1;
          }
          if (!bVar8) goto LAB_0099ad22;
          iVar31 = iVar31 + 1;
        } while (iVar31 < info->mFunctionImportCount);
        iVar11 = 0xd;
      }
LAB_0099ad22:
      if (iVar11 != 4) {
        if (iVar11 != 0xd) {
          return local_60;
        }
        *(DisableImplicitFlags *)(lVar6 + 0x1542) = DVar1;
        *(ImplicitCallFlags *)(lVar6 + 0x1570) = IVar2;
        local_c8 = (undefined1  [8])&FrameDisplay::typeinfo;
        data.typeinfo = (type_info *)&DAT_00000008;
        data.plusSize = 0xffffffffffffffff;
        data.count = (size_t)anon_var_dwarf_4bd2daf;
        data.filename._0_4_ = 0xae7;
        pRVar12 = Memory::Recycler::TrackAllocInfo
                            (*(Recycler **)(*(long *)(this + 0x78) + 0x1200),
                             (TrackAllocData *)local_c8);
        index = 0;
        environment = (FrameDisplay *)new<Memory::Recycler>(8,pRVar12,0x75cc48,0);
        environment->tag = true;
        environment->strictMode = false;
        environment->length = 0;
        environment->unused = 0;
        if (0 < info->mFunctionCount) {
          do {
            pMVar21 = AsmJsModuleInfo::GetFunction(info,index);
            infoRef = ParseableFunctionInfo::GetNestedFuncReference
                                (*(ParseableFunctionInfo **)(this + 0x88),index);
            function = AsmJsScriptFunction::OP_NewAsmJsFunc(environment,infoRef);
            pWVar26 = local_50 + (long)iVar4 + (ulong)pMVar21->location;
            Memory::Recycler::WBSetBit((char *)pWVar26);
            pWVar26->ptr = function;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar26);
            if (((function->super_ScriptFunction).super_ScriptFunctionBase.super_JavascriptFunction.
                 super_DynamicObject.super_RecyclableObject.type.ptr)->entryPoint ==
                JavascriptFunction::DeferredDeserializeThunk) {
              JavascriptFunction::DeferredDeserialize(&function->super_ScriptFunction);
            }
            ((function->super_ScriptFunction).super_ScriptFunctionBase.super_JavascriptFunction.
             super_DynamicObject.super_RecyclableObject.type.ptr)->entryPoint =
                 AsmJsExternalEntryPoint;
            this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
            pvVar22 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_01,AsmJsFunctionInfo);
            Memory::Recycler::WBSetBit((char *)((long)pvVar22 + 0xa8));
            *(FunctionProxy **)((long)pvVar22 + 0xa8) = this_00;
            Memory::RecyclerWriteBarrierManager::WriteBarrier((char *)((long)pvVar22 + 0xa8));
            Memory::Recycler::WBSetBit((char *)&function->m_moduleEnvironment);
            (function->m_moduleEnvironment).ptr = local_50;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(&function->m_moduleEnvironment);
            if (info->mIsProcessed == false) {
              pPVar23 = ScriptFunction::GetEntryPointInfo(&function->super_ScriptFunction);
              *(byte *)&pPVar23[1].super_ExpirableObject.super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
                   *(byte *)&pPVar23[1].super_ExpirableObject.super_FinalizableObject.
                             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject | 8;
              bVar8 = Phases::IsEnabled((Phases *)&DAT_015c1bd0,AsmJsJITTemplatePhase);
              if (!bVar8) {
                pPVar23->jsMethod = AsmJsDelayDynamicInterpreterThunk;
              }
            }
            index = index + 1;
          } while ((int)index < info->mFunctionCount);
        }
        if (0 < info->mFunctionTableCount) {
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          lVar29 = 0;
          do {
            pMVar24 = AsmJsModuleInfo::GetFunctionTable(info,(int)lVar29);
            data.plusSize = (size_t)pMVar24->size;
            local_c8 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
            data.typeinfo = (type_info *)0x0;
            data.count = (size_t)anon_var_dwarf_4bd2daf;
            data.filename._0_4_ = 0xb11;
            pRVar12 = Memory::Recycler::TrackAllocInfo
                                (*(Recycler **)(*(long *)(this + 0x78) + 0x1200),
                                 (TrackAllocData *)local_c8);
            uVar30 = pMVar24->size;
            if ((ulong)uVar30 == 0) {
              Memory::Recycler::ClearTrackAllocInfo(pRVar12,(TrackAllocData *)0x0);
              local_40 = &DAT_00000008;
            }
            else {
              BVar9 = ExceptionCheck::CanHandleOutOfMemory();
              if (BVar9 == 0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar13 = 1;
                bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                            ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                            "ExceptionCheck::CanHandleOutOfMemory()");
                if (!bVar8) goto LAB_0099b329;
                *puVar13 = 0;
              }
              sVar32 = (ulong)uVar30 << 3;
              local_40 = Memory::Recycler::
                         AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                                   (pRVar12,sVar32);
              if (local_40 == (char *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar13 = 1;
                bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                            ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
                if (!bVar8) goto LAB_0099b329;
                *puVar13 = 0;
              }
              memset(local_40,0,sVar32);
            }
            if (pMVar24->size != 0) {
              uVar28 = 0;
              addr_00 = local_40;
              do {
                pvVar22 = local_50[(long)iVar4 + (ulong)(pMVar24->moduleFunctionIndex).ptr[uVar28]].
                          ptr;
                Memory::Recycler::WBSetBit(addr_00);
                *(void **)addr_00 = pvVar22;
                Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
                uVar28 = uVar28 + 1;
                addr_00 = addr_00 + 8;
              } while (uVar28 < pMVar24->size);
            }
            pWVar26 = local_50 + iVar5 + lVar29;
            Memory::Recycler::WBSetBit((char *)pWVar26);
            pWVar26->ptr = local_40;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar26);
            lVar29 = lVar29 + 1;
          } while (lVar29 < info->mFunctionTableCount);
        }
        bVar8 = Phases::IsEnabled((Phases *)&DAT_015c1bd0,AsmJsJITTemplatePhase);
        if (((bVar8) && (DAT_015bbe00 == 0)) ||
           ((bVar8 = Phases::IsEnabled((Phases *)&DAT_015c1bd0,AsmJsJITTemplatePhase), !bVar8 &&
            ((DAT_015bbe08 == 0 || (DAT_015b5faa == '\x01')))))) {
          bVar8 = Phases::IsEnabled((Phases *)&DAT_015cd718,AsmjsEntryPointInfoPhase);
          if (bVar8) {
            iVar11 = (*(this_00->super_FinalizableObject).super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject[7])(this_00);
            Output::Print(L"%s Scheduling For Full JIT at callcount:%d\n",
                          CONCAT44(extraout_var,iVar11),0);
            Output::Flush();
          }
          if (0 < info->mFunctionCount) {
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            lVar29 = 0;
            do {
              func = (ScriptFunction *)local_50[iVar4 + lVar29].ptr;
              if (func == (ScriptFunction *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar13 = 1;
                bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                            ,0xb2b,"(functionObj != nullptr)",
                                            "functionObj != nullptr");
                if (!bVar8) goto LAB_0099b329;
                *puVar13 = 0;
              }
              p_Var25 = RecyclableObject::GetEntryPoint((RecyclableObject *)func);
              if (p_Var25 == AsmJsExternalEntryPoint) {
                WAsmJs::JitFunctionIfReady(func,0);
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 < info->mFunctionCount);
          }
        }
        info->mIsProcessed = true;
        if (info->mExportsCount != 0) {
          propIds = (info->mExports).ptr;
          pSVar27 = *(ScriptContext **)(this + 0x78);
          literalType = FunctionBody::GetObjectLiteralTypeRef(*(FunctionBody **)(this + 0x88),0);
          pvVar14 = JavascriptOperators::NewScObjectLiteral(pSVar27,propIds,literalType);
          if (0 < info->mExportsCount) {
            lVar29 = 0;
            do {
              JavascriptOperators::OP_InitProperty
                        (pvVar14,(&(info->mExports).ptr[1].count)[lVar29],
                         local_50[(long)iVar4 + (ulong)(info->mExportsFunctionLocation).ptr[lVar29]]
                         .ptr);
              lVar29 = lVar29 + 1;
            } while (lVar29 < info->mExportsCount);
          }
          ValidateRegValue(this,pvVar14,false,true);
          *(Var *)(this + 0x160) = pvVar14;
          return pvVar14;
        }
        pvVar14 = local_50[(long)iVar4 + (ulong)info->mExportFunctionIndex].ptr;
        ValidateRegValue(this,pvVar14,false,true);
        *(Var *)(this + 0x160) = pvVar14;
        return pvVar14;
      }
    }
  }
  *(DisableImplicitFlags *)(lVar6 + 0x1542) = DVar1;
  *(ImplicitCallFlags *)(lVar6 + 0x1570) = IVar2;
LAB_0099b21c:
  pvVar14 = ProcessLinkFailedAsmJsModule(this);
  return pvVar14;
}

Assistant:

Var InterpreterStackFrame::ProcessAsmJsModule()
    {
        FunctionBody* asmJsModuleFunctionBody = GetFunctionBody();
        AsmJsModuleInfo* info = asmJsModuleFunctionBody->GetAsmJsModuleInfo();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Configuration::Global.flags.ForceAsmJsLinkFail)
        {
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Forcing link failure"));
            return this->ProcessLinkFailedAsmJsModule();
        }
#endif
        if (m_inSlotsCount != info->GetArgInCount() + 1)
        {
            // Error reparse without asm.js
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Invalid module argument count"));
            return this->ProcessLinkFailedAsmJsModule();
        }

        const AsmJsModuleMemory& moduleMemory = info->GetModuleMemory();
        Field(Var)* moduleMemoryPtr = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), moduleMemory.mMemorySize);
        Field(Var)* arrayBufferPtr = moduleMemoryPtr + moduleMemory.mArrayBufferOffset;
        Assert(moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset);
        Field(Var)* stdLibPtr = moduleMemoryPtr + moduleMemory.mStdLibOffset;
        int* localIntSlots = (int*)(moduleMemoryPtr + moduleMemory.mIntOffset);
        float* localFloatSlots = (float*)(moduleMemoryPtr + moduleMemory.mFloatOffset);
        double* localDoubleSlots = (double*)(moduleMemoryPtr + moduleMemory.mDoubleOffset);
        Field(Var)* localFunctionImports = moduleMemoryPtr + moduleMemory.mFFIOffset;
        Field(Var)* localModuleFunctions = moduleMemoryPtr + moduleMemory.mFuncOffset;
        Field(Field(Var)*)* localFunctionTables = (Field(Field(Var)*)*)(moduleMemoryPtr + moduleMemory.mFuncPtrOffset);

        ThreadContext* threadContext = this->scriptContext->GetThreadContext();
        *stdLibPtr = (m_inSlotsCount > 1) ? m_inParams[1] : nullptr;

        Var foreign = (m_inSlotsCount > 2) ? m_inParams[2] : nullptr;
        *arrayBufferPtr = (m_inSlotsCount > 3) ? m_inParams[3] : nullptr;
        //cache the current state of the disable implicit call flag
        DisableImplicitFlags prevDisableImplicitFlags = threadContext->GetDisableImplicitFlags();
        ImplicitCallFlags saveImplicitcallFlags = threadContext->GetImplicitCallFlags();
        // Disable implicit calls to check if any of the VarImport or Function Import leads to implicit calls
        threadContext->DisableImplicitCall();
        threadContext->SetImplicitCallFlags(ImplicitCallFlags::ImplicitCall_None);
        bool checkParamResult = ASMLink::CheckParams(this->scriptContext, info, *stdLibPtr, foreign, *arrayBufferPtr);
        if (!checkParamResult)
        {
            // don't need to print, because checkParams will do it for us
            goto linkFailure;
        }
        else if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
        {
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Params have side effects"));
            return this->ProcessLinkFailedAsmJsModule();
        }
        // Initialize Variables
        for (int i = 0; i < info->GetVarCount(); i++)
        {
            const auto& var = info->GetVar(i);
            const AsmJsVarType type(var.type);
            if (type.isInt())
            {
                localIntSlots[var.location] = var.initialiser.intInit;
            }
            else if (type.isFloat())
            {
                localFloatSlots[var.location] = var.initialiser.floatInit;
            }
            else if (type.isDouble())
            {
                localDoubleSlots[var.location] = var.initialiser.doubleInit;
            }
            else
            {
                Assert(UNREACHED);
            }
        }

        // Load constant variables
        for (int i = 0; i < info->GetVarImportCount(); i++)
        {
            const auto& import = info->GetVarImport(i);
            const AsmJsVarType type(import.type);
            // this might throw, but it would anyway in non-asm.js
            Var value = JavascriptOperators::OP_GetProperty(foreign, import.field, scriptContext);
            // check if there is implicit call and if there is implicit call then clear the disableimplicitcall flag
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing var import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
            if (CONFIG_FLAG(AsmJsEdge))
            {
                // emscripten had a bug which caused this check to fail in some circumstances, so this check fails for some demos
                if (!TaggedNumber::Is(value) && (!VarIs<RecyclableObject>(value) || DynamicType::Is(VarTo<RecyclableObject>(value)->GetTypeId())))
                {
                    AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Var import %s must be primitive"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                    goto linkFailure;
                }
            }

            if (type.isInt())
            {
                int val = JavascriptMath::ToInt32(value, scriptContext);
                localIntSlots[import.location] = val;
            }
            else if (type.isFloat())
            {
                float val = (float)JavascriptConversion::ToNumber(value, scriptContext);
                localFloatSlots[import.location] = val;
            }
            else if (type.isDouble())
            {
                double val = JavascriptConversion::ToNumber(value, scriptContext);
                localDoubleSlots[import.location] = val;
            }

            // check for implicit call after converting to number
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                // Runtime error
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing var import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
        }
        // Load external functions
        for (int i = 0; i < info->GetFunctionImportCount(); i++)
        {
            const auto& import = info->GetFunctionImport(i);
            // this might throw, but it would anyway in non-asm.js
            Var importFunc = JavascriptOperators::OP_GetProperty(foreign, import.field, scriptContext);
            // check if there is implicit call and if there is implicit call then clear the disableimplicitcall flag
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing foreign function import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
            if (!VarIs<JavascriptFunction>(importFunc))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Foreign function import %s is not a function"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                goto linkFailure;
            }
            localFunctionImports[import.location] = importFunc;
        }

        threadContext->SetDisableImplicitFlags(prevDisableImplicitFlags);
        threadContext->SetImplicitCallFlags(saveImplicitcallFlags);
        // scope
        {
            FrameDisplay* pDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), sizeof(void*), FrameDisplay, 0);
            //DynamicObject* asmModule = scriptContext->GetLibrary()->CreateObject(false, 1);
            //JavascriptOperators::OP_SetProperty(asmModule, PropertyIds::module, moduleMemoryPtr, scriptContext);
            //pDisplay->SetItem(0, this->function);
            for (int i = 0; i < info->GetFunctionCount(); i++)
            {
                const auto& modFunc = info->GetFunction(i);

                // TODO: add more runtime checks here
                FunctionInfoPtrPtr functionInfo = m_functionBody->GetNestedFuncReference(i);

                AsmJsScriptFunction* scriptFuncObj = AsmJsScriptFunction::OP_NewAsmJsFunc(pDisplay, functionInfo);
                localModuleFunctions[modFunc.location] = scriptFuncObj;

                if (scriptFuncObj->GetDynamicType()->GetEntryPoint() == DefaultDeferredDeserializeThunk)
                {
                    JavascriptFunction::DeferredDeserialize(scriptFuncObj);
                }

                scriptFuncObj->GetDynamicType()->SetEntryPoint(AsmJsExternalEntryPoint);
                scriptFuncObj->GetFunctionBody()->GetAsmJsFunctionInfo()->SetModuleFunctionBody(asmJsModuleFunctionBody);
                scriptFuncObj->SetModuleEnvironment(moduleMemoryPtr);
                if (!info->IsRuntimeProcessed())
                {
                    // don't reset entrypoint upon relinking
                    FunctionEntryPointInfo* entrypointInfo = (FunctionEntryPointInfo*)scriptFuncObj->GetEntryPointInfo();
                    entrypointInfo->SetIsAsmJSFunction(true);

#if DYNAMIC_INTERPRETER_THUNK
                    if (!PHASE_ON1(AsmJsJITTemplatePhase))
                    {
                        entrypointInfo->jsMethod = AsmJsDefaultEntryThunk;
                    }
#endif
                }
            }
        }

        // Initialize function table arrays
        for (int i = 0; i < info->GetFunctionTableCount(); i++)
        {
            const auto& modFuncTable = info->GetFunctionTable(i);
            Field(Var)* funcTableArray = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), modFuncTable.size);
            for (uint j = 0; j < modFuncTable.size; j++)
            {
                // get the module function index
                const RegSlot index = modFuncTable.moduleFunctionIndex[j];
                // assign the module function pointer to the array
                Var functionPtr = localModuleFunctions[index];
                funcTableArray[j] = functionPtr;
            }
            localFunctionTables[i] = funcTableArray;
        }
        // Do MTJRC/MAIC:0 check
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (
            (PHASE_ON1(Js::AsmJsJITTemplatePhase) && CONFIG_FLAG(MaxTemplatizedJitRunCount) == 0) ||
            (!PHASE_ON1(Js::AsmJsJITTemplatePhase) && (CONFIG_FLAG(MaxAsmJsInterpreterRunCount) == 0 || CONFIG_FLAG(ForceNative)))
            )
        {
            if (PHASE_TRACE1(AsmjsEntryPointInfoPhase))
            {
                Output::Print(_u("%s Scheduling For Full JIT at callcount:%d\n"), asmJsModuleFunctionBody->GetDisplayName(), 0);
                Output::Flush();
            }
            for (int i = 0; i < info->GetFunctionCount(); i++)
            {
                ScriptFunction* functionObj = (ScriptFunction*)PointerValue(localModuleFunctions[i]);
                AnalysisAssert(functionObj != nullptr);
                // don't want to generate code for APIs like changeHeap
                if (functionObj->GetEntryPoint() == Js::AsmJsExternalEntryPoint)
                {
                    WAsmJs::JitFunctionIfReady(functionObj);
                }
            }
        }
#endif

        info->SetIsRuntimeProcessed(true);

        // create export object
        if (info->GetExportsCount())
        {
            Var newObj = JavascriptOperators::NewScObjectLiteral(GetScriptContext(), info->GetExportsIdArray(),
                this->GetFunctionBody()->GetObjectLiteralTypeRef(0));
            for (int i = 0; i < info->GetExportsCount(); i++)
            {
                auto ex = info->GetExport(i);
                Var func = localModuleFunctions[*ex.location];
                JavascriptOperators::OP_InitProperty(newObj, *ex.id, func);
            }
            SetReg((RegSlot)0, newObj);
            return newObj;
        }


        // export only 1 function
        {
            Var exportFunc = localModuleFunctions[info->GetExportFunctionIndex()];
            SetReg((RegSlot)0, exportFunc);
            return exportFunc;
        }

    linkFailure:
        threadContext->SetDisableImplicitFlags(prevDisableImplicitFlags);
        threadContext->SetImplicitCallFlags(saveImplicitcallFlags);
        return this->ProcessLinkFailedAsmJsModule();
    }